

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
          *f)

{
  ulong uVar1;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> bVar2;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> bVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)spec->width_;
  uVar1 = f->size_;
  uVar4 = uVar5 - uVar1;
  if (uVar5 < uVar1 || uVar4 == 0) {
LAB_001ed7c2:
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
                  *)f,(counting_iterator<char> *)this);
    return;
  }
  bVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> *)
           &spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    bVar2 = bVar3;
    if (uVar4 < 2) {
      bVar2 = SUB41(*(undefined4 *)(this + 8),0);
    }
    *(ulong *)this = *(long *)this + (uVar4 >> 1);
    this[8] = bVar2;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
                  *)f,(counting_iterator<char> *)this);
    if (uVar5 == uVar1) {
      bVar3 = SUB41(*(undefined4 *)(this + 8),0);
    }
    *(ulong *)this = *(long *)this + (uVar4 - (uVar4 >> 1));
    this[8] = bVar3;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      if (uVar5 == uVar1) {
        bVar3 = SUB41(*(undefined4 *)(this + 8),0);
      }
      *(ulong *)this = *(long *)this + uVar4;
      this[8] = bVar3;
      goto LAB_001ed7c2;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
                  *)f,(counting_iterator<char> *)this);
    if (uVar5 == uVar1) {
      bVar3 = SUB41(*(undefined4 *)(this + 8),0);
    }
    *(ulong *)this = *(long *)this + uVar4;
    this[8] = bVar3;
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }